

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O1

void __thiscall wabt::MemoryImport::~MemoryImport(MemoryImport *this)

{
  pointer pcVar1;
  
  (this->super_ImportMixin<(wabt::ExternalKind)2>).super_Import._vptr_Import =
       (_func_int **)&PTR__MemoryImport_002d7c18;
  pcVar1 = (this->memory).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->memory).name.field_2) {
    operator_delete(pcVar1);
  }
  Import::~Import((Import *)this);
  operator_delete(this);
  return;
}

Assistant:

explicit MemoryImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Memory>(), memory(name) {}